

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void __thiscall
util::exception::exception<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
          (exception *this,CylHead *args,char (*args_1) [8],int *args_2,char (*args_3) [29],
          int *args_4,char (*args_5) [2])

{
  _Alloc_hider in_stack_ffffffffffffffd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  make_string<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
            ((string *)&stack0xffffffffffffffd0,(util *)args,(CylHead *)args_1,(char (*) [8])args_2,
             (int *)args_3,(char (*) [29])args_4,(int *)args_5,
             (char (*) [2])in_stack_ffffffffffffffd0._M_p);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&stack0xffffffffffffffd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffffd0._M_p != &local_20) {
    operator_delete(in_stack_ffffffffffffffd0._M_p,local_20._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_001dbba8;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}